

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

GCstr * lex_str(LexState *ls)

{
  uint uVar1;
  
  if (ls->token == 0x11f) {
    uVar1 = (ls->tokenval).u32.lo;
    lj_lex_next(ls);
    return (GCstr *)(ulong)uVar1;
  }
  err_token(ls,0x11f);
}

Assistant:

static GCstr *lex_str(LexState *ls)
{
  GCstr *s;
  if (ls->token != TK_name && (LJ_52 || ls->token != TK_goto))
    err_token(ls, TK_name);
  s = strV(&ls->tokenval);
  lj_lex_next(ls);
  return s;
}